

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol_edge_state.cpp
# Opt level: O1

void MOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BCRec *bcrec;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  pair<bool,_bool> pVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  int iVar28;
  long lVar29;
  double *pdVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  double *pdVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  double *pdVar52;
  double *pdVar53;
  bool bVar54;
  bool bVar55;
  ulong uVar56;
  ulong uVar57;
  double dVar58;
  ulong uVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  ulong uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ulong uVar78;
  undefined1 auVar77 [16];
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double *local_200;
  double *local_1f8;
  ulong local_1f0;
  long local_1e0;
  double *local_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  double *local_198;
  ulong local_190;
  double *local_180;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_128;
  double *local_118;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e0;
  double *local_d8;
  double *local_c0;
  
  iVar1 = (domain->smallend).vect[0];
  iVar2 = (domain->smallend).vect[2];
  lVar51 = (long)iVar1;
  iVar3 = (domain->bigend).vect[0];
  iVar4 = (bx->bigend).vect[0];
  iVar5 = (bx->bigend).vect[1];
  uVar6 = (bx->btype).itype;
  iVar41 = (~uVar6 & 1) + iVar4;
  iVar33 = iVar5 + (uint)((uVar6 & 2) == 0);
  iVar7 = (domain->smallend).vect[1];
  lVar24 = (long)iVar7;
  iVar46 = (domain->bigend).vect[1];
  iVar34 = (domain->bigend).vect[2];
  iVar8 = (bx->smallend).vect[0];
  iVar9 = (bx->smallend).vect[2];
  iVar10 = (bx->smallend).vect[1];
  lVar21 = (long)iVar10;
  iVar37 = (bx->bigend).vect[2];
  iVar20 = iVar37 + (uint)((uVar6 & 4) == 0);
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  lVar48 = (long)iVar8;
  pVar19 = anon_unknown.dwarf_53122a::has_extdir_or_ho(bcrec,ncomp,0);
  if (((pVar19.first & iVar8 + -1 <= iVar1) == 0) &&
     ((((ushort)pVar19 >> 8 & 1) == 0 || (iVar41 < iVar3)))) {
    if (0 < ncomp) {
      lVar15 = q->jstride;
      uVar6 = (q->begin).x;
      lVar29 = umac->jstride;
      lVar25 = xedge->jstride;
      iVar32 = (umac->begin).y;
      iVar28 = (umac->begin).x;
      lVar22 = (long)(q->begin).y;
      pdVar16 = umac->p;
      lVar26 = umac->kstride;
      iVar36 = (umac->begin).z;
      local_168 = xedge->p +
                  (((lVar21 - (xedge->begin).y) * lVar25 + lVar48) - (long)(xedge->begin).x);
      lVar17 = xedge->kstride;
      lVar18 = xedge->nstride;
      iVar11 = (xedge->begin).z;
      lVar49 = (iVar3 + 1) - lVar48;
      pdVar30 = q->p;
      local_148 = pdVar30 + (((lVar21 - lVar22) * lVar15 + lVar48) - (long)(int)uVar6);
      iVar12 = (q->begin).z;
      lVar40 = q->kstride;
      lVar44 = q->nstride;
      local_1f8 = (double *)0x0;
      do {
        if (iVar9 <= iVar37) {
          lVar43 = (long)local_1f8 * lVar44;
          bVar27 = local_1f8 == (double *)0x0 && is_velocity;
          iVar31 = iVar9;
          do {
            if (iVar10 <= iVar5) {
              lVar23 = (long)iVar31;
              lVar45 = (long)pdVar16 +
                       (lVar23 - iVar36) * lVar26 * 8 +
                       lVar48 * 8 + (lVar21 - iVar32) * lVar29 * 8 + (long)iVar28 * -8;
              pdVar47 = (double *)((lVar23 - iVar11) * lVar17 * 8 + (long)local_168);
              pdVar52 = (double *)((lVar23 - iVar12) * lVar40 * 8 + (long)local_148);
              lVar23 = (iVar31 - iVar12) * lVar40;
              local_1a8 = (double *)lVar21;
              do {
                if (iVar8 <= iVar41) {
                  lVar38 = ((long)local_1a8 - lVar22) * lVar15;
                  iVar13 = d_bcrec_ptr[(long)local_1f8].bc[0];
                  iVar14 = d_bcrec_ptr[(long)local_1f8].bc[3];
                  lVar39 = 0;
                  do {
                    dVar70 = pdVar52[lVar39];
                    iVar42 = (int)lVar39;
                    dVar62 = pdVar30[lVar38 + lVar23 + lVar43 + (int)(~uVar6 + iVar8 + iVar42)];
                    dVar66 = (dVar70 - dVar62) + (dVar70 - dVar62);
                    dVar58 = dVar62 - pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + -2
                                                                              + iVar42)];
                    dVar65 = pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + 1 + iVar42)]
                             - dVar70;
                    dVar58 = dVar58 + dVar58;
                    dVar65 = dVar65 + dVar65;
                    auVar67._0_8_ = ABS(dVar66);
                    auVar67._8_8_ = ABS(dVar65);
                    dVar61 = (dVar70 - pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + -2
                                                                               + iVar42)]) * 0.5;
                    dVar60 = (pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + 1 + iVar42)
                                     ] - dVar62) * 0.5;
                    auVar72._0_8_ = ABS(dVar58);
                    uVar59 = -(ulong)(0.0 < dVar61);
                    uVar56 = -(ulong)(0.0 < dVar60);
                    auVar80._0_8_ = ABS(dVar61);
                    auVar80._8_8_ = ABS(dVar60);
                    auVar72._8_8_ = auVar67._0_8_;
                    auVar83 = minpd(auVar80,auVar72);
                    auVar83 = minpd(auVar67,auVar83);
                    uVar57 = -(ulong)(0.0 < dVar66 * dVar58) & auVar83._0_8_;
                    uVar71 = -(ulong)(0.0 < dVar66 * dVar65) & auVar83._8_8_;
                    auVar73._0_8_ = uVar57 & uVar59;
                    auVar73._8_8_ = uVar71 & uVar56;
                    auVar83._0_8_ = ~uVar59 & (uVar57 ^ 0x8000000000000000);
                    auVar83._8_8_ = ~uVar56 & (uVar71 ^ 0x8000000000000000);
                    dVar62 = SUB168(auVar83 | auVar73,0) * 0.5 + dVar62;
                    dVar70 = SUB168(auVar83 | auVar73,8) * -0.5 + dVar70;
                    if (lVar51 - lVar48 == lVar39) {
                      switch(iVar13) {
                      case 0:
                        break;
                      case 1:
                      case 2:
                      case 4:
                        dVar62 = dVar70;
                        break;
                      case 3:
                        dVar62 = pdVar30[lVar38 + lVar23 + (int)(iVar1 + ~uVar6) + lVar43];
                        if (bVar27) {
                          dVar70 = dVar62;
                        }
                        break;
                      case -1:
                        dVar62 = 0.0;
                        dVar70 = 0.0;
                        break;
                      default:
                        goto switchD_002cba62_default;
                      }
                    }
                    else if (lVar49 == lVar39) {
                      switch(iVar14) {
                      case 1:
                      case 2:
                      case 4:
                        dVar70 = dVar62;
                        break;
                      case 3:
                        dVar70 = pdVar30[lVar38 + lVar23 + (int)((iVar3 + 1) - uVar6) + lVar43];
                        if (bVar27) {
                          dVar62 = dVar70;
                        }
                        break;
                      case -1:
                        dVar62 = 0.0;
                        dVar70 = 0.0;
                      }
                    }
switchD_002cba62_default:
                    if ((lVar51 - lVar48 == lVar39) && ((iVar13 == 4 || (iVar13 == 2)))) {
                      dVar66 = dVar70;
                      if ((is_velocity) && (dVar66 = 0.0, dVar70 <= 0.0)) {
                        dVar66 = dVar70;
                      }
                      dVar62 = dVar70;
                      if (local_1f8 == (double *)0x0) {
                        uVar59 = -(ulong)(0.0 <= *(double *)(lVar45 + lVar39 * 8));
                        dVar62 = (double)(uVar59 & (ulong)dVar66 | ~uVar59 & (ulong)dVar70);
                        dVar70 = dVar62;
                      }
                    }
                    if ((lVar49 == lVar39) && ((iVar14 == 4 || (iVar14 == 2)))) {
                      dVar66 = dVar62;
                      if ((is_velocity) && (dVar66 = 0.0, 0.0 <= dVar62)) {
                        dVar66 = dVar62;
                      }
                      dVar70 = dVar62;
                      if (local_1f8 == (double *)0x0) {
                        uVar59 = -(ulong)(*(double *)(lVar45 + lVar39 * 8) <= 0.0);
                        dVar62 = (double)(~uVar59 & (ulong)dVar62 | (ulong)dVar66 & uVar59);
                        dVar70 = dVar62;
                      }
                    }
                    dVar66 = *(double *)(lVar45 + lVar39 * 8);
                    dVar58 = dVar62;
                    if ((dVar66 <= 1e-08) && (dVar58 = dVar70, -1e-08 <= dVar66)) {
                      dVar58 = (dVar70 + dVar62) * 0.5;
                    }
                    pdVar47[lVar39] = dVar58;
                    lVar39 = lVar39 + 1;
                  } while ((iVar41 - iVar8) + 1 != (int)lVar39);
                }
                local_1a8 = (double *)((long)local_1a8 + 1);
                lVar45 = lVar45 + lVar29 * 8;
                pdVar47 = pdVar47 + lVar25;
                pdVar52 = pdVar52 + lVar15;
              } while (iVar5 + 1 != (int)local_1a8);
            }
            bVar54 = iVar31 != iVar37;
            iVar31 = iVar31 + 1;
          } while (bVar54);
        }
        local_1f8 = (double *)((long)local_1f8 + 1);
        local_168 = local_168 + lVar18;
        local_148 = local_148 + lVar44;
      } while (local_1f8 != (double *)(ulong)(uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar15 = q->jstride;
    lVar29 = umac->jstride;
    lVar25 = xedge->jstride;
    iVar32 = (umac->begin).y;
    iVar28 = (umac->begin).x;
    lVar22 = (long)(q->begin).y;
    uVar6 = (q->begin).x;
    iVar31 = iVar3 + 1;
    lVar26 = umac->kstride;
    pdVar16 = umac->p;
    local_f8 = xedge->p + (((lVar21 - (xedge->begin).y) * lVar25 + lVar48) - (long)(xedge->begin).x)
    ;
    iVar36 = (umac->begin).z;
    lVar17 = xedge->kstride;
    lVar18 = xedge->nstride;
    iVar11 = (xedge->begin).z;
    lVar49 = lVar51 - lVar48;
    pdVar30 = q->p;
    local_100 = pdVar30 + (((lVar21 - lVar22) * lVar15 + lVar48) - (long)(int)uVar6);
    iVar12 = (q->begin).z;
    lVar40 = q->kstride;
    lVar44 = q->nstride;
    local_1f0 = 0;
    do {
      if (iVar9 <= iVar37) {
        bVar27 = local_1f0 == 0 && is_velocity;
        lVar43 = local_1f0 * lVar44;
        iVar13 = iVar9;
        do {
          if (iVar10 <= iVar5) {
            lVar23 = (long)iVar13;
            lVar45 = (long)pdVar16 +
                     (lVar23 - iVar36) * lVar26 * 8 +
                     lVar48 * 8 + (lVar21 - iVar32) * lVar29 * 8 + (long)iVar28 * -8;
            pdVar52 = (double *)((lVar23 - iVar11) * lVar17 * 8 + (long)local_f8);
            pdVar47 = (double *)((lVar23 - iVar12) * lVar40 * 8 + (long)local_100);
            lVar23 = (iVar13 - iVar12) * lVar40;
            local_1e0 = lVar21;
            do {
              if (iVar8 <= iVar41) {
                iVar14 = d_bcrec_ptr[local_1f0].bc[0];
                iVar42 = d_bcrec_ptr[local_1f0].bc[3];
                lVar38 = (local_1e0 - lVar22) * lVar15;
                lVar39 = 0;
                do {
                  if ((iVar14 == 3) && (lVar48 + lVar39 <= lVar51)) {
                    dVar58 = pdVar30[lVar38 + lVar23 + (int)(~uVar6 + iVar1) + lVar43];
                  }
                  else if ((iVar42 == 3) && ((long)iVar3 < lVar48 + lVar39)) {
                    dVar58 = pdVar30[lVar38 + lVar23 + (int)(iVar31 - uVar6) + lVar43];
                  }
                  else {
                    dVar62 = pdVar47[lVar39 + -1];
                    dVar66 = pdVar47[lVar39];
                    iVar35 = (int)lVar39;
                    dVar70 = pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + 1 + iVar35)]
                    ;
                    if (lVar49 == lVar39 && iVar14 - 3U < 2) {
                      dVar58 = dVar62 * -4.0 + dVar66 * 3.0 + dVar70;
LAB_002cb222:
                      dVar58 = dVar58 / 3.0;
                    }
                    else {
                      dVar58 = (dVar70 - dVar62) * 0.5;
                      if ((iVar14 == 4 || iVar42 == 3) && iVar3 - lVar48 == lVar39) {
                        dVar58 = (dVar70 * 4.0 + dVar66 * -3.0) - dVar62;
                        goto LAB_002cb222;
                      }
                    }
                    dVar79 = (dVar66 - dVar62) + (dVar66 - dVar62);
                    dVar60 = (dVar70 - dVar66) + (dVar70 - dVar66);
                    dVar65 = ABS(dVar79);
                    dVar61 = ABS(dVar60);
                    dVar70 = ABS(dVar58);
                    if (dVar65 <= ABS(dVar58)) {
                      dVar70 = dVar65;
                    }
                    if (dVar70 <= dVar61) {
                      dVar61 = dVar70;
                    }
                    uVar59 = -(ulong)(0.0 < dVar79 * dVar60) & (ulong)dVar61;
                    dVar70 = pdVar30[lVar38 + lVar23 + lVar43 + (int)((iVar8 - uVar6) + -2 + iVar35)
                                    ];
                    if ((iVar14 - 3U < 2) && ((iVar1 - iVar8) + 1 == iVar35)) {
                      dVar61 = dVar70 * -4.0 + dVar62 * 3.0 + dVar66;
LAB_002cb322:
                      dVar61 = dVar61 / 3.0;
                    }
                    else {
                      dVar61 = (dVar66 - dVar70) * 0.5;
                      if ((iVar14 == 4 || iVar42 == 3) && iVar31 - iVar8 == iVar35) {
                        dVar61 = (dVar66 * 4.0 + dVar62 * -3.0) - dVar70;
                        goto LAB_002cb322;
                      }
                    }
                    dVar66 = (double)(~-(ulong)(0.0 < dVar58) & (uVar59 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar58) & uVar59) * -0.5 + dVar66;
                    dVar58 = (dVar62 - dVar70) + (dVar62 - dVar70);
                    dVar60 = ABS(dVar58);
                    dVar70 = ABS(dVar61);
                    if (dVar60 <= ABS(dVar61)) {
                      dVar70 = dVar60;
                    }
                    if (dVar70 <= dVar65) {
                      dVar65 = dVar70;
                    }
                    uVar59 = -(ulong)(0.0 < dVar79 * dVar58) & (ulong)dVar65;
                    dVar62 = (double)(~-(ulong)(0.0 < dVar61) & (uVar59 ^ 0x8000000000000000) |
                                     -(ulong)(0.0 < dVar61) & uVar59) * 0.5 + dVar62;
                    if (lVar49 == lVar39) {
                      switch(iVar14) {
                      case 1:
                      case 2:
                      case 4:
switchD_002cb3ab_caseD_1:
                        dVar62 = dVar66;
                        break;
                      case 3:
                        dVar62 = pdVar30[lVar38 + lVar23 + (int)(~uVar6 + iVar1) + lVar43];
                        if (bVar27) {
switchD_002cb3d1_caseD_1:
                          dVar66 = dVar62;
                          dVar62 = dVar66;
                        }
                        break;
                      case -1:
switchD_002cb3ab_caseD_ffffffff:
                        dVar62 = 0.0;
                        dVar66 = 0.0;
                      }
                    }
                    else if (iVar31 - lVar48 == lVar39) {
                      switch(iVar42) {
                      case 1:
                      case 2:
                      case 4:
                        goto switchD_002cb3d1_caseD_1;
                      case 3:
                        dVar66 = pdVar30[lVar38 + lVar23 + (int)(iVar31 - uVar6) + lVar43];
                        if (bVar27) goto switchD_002cb3ab_caseD_1;
                        break;
                      case -1:
                        goto switchD_002cb3ab_caseD_ffffffff;
                      }
                    }
                    if ((lVar49 == lVar39) && ((iVar14 == 4 || (iVar14 == 2)))) {
                      dVar70 = dVar66;
                      if ((is_velocity) && (dVar70 = 0.0, dVar66 <= 0.0)) {
                        dVar70 = dVar66;
                      }
                      dVar62 = dVar66;
                      if (local_1f0 == 0) {
                        uVar59 = -(ulong)(0.0 <= *(double *)(lVar45 + lVar39 * 8));
                        dVar66 = (double)(uVar59 & (ulong)dVar70 | ~uVar59 & (ulong)dVar66);
                        dVar62 = dVar66;
                      }
                    }
                    if ((iVar31 - lVar48 == lVar39) && ((iVar42 == 4 || (iVar42 == 2)))) {
                      dVar70 = dVar62;
                      if ((is_velocity) && (dVar70 = 0.0, 0.0 <= dVar62)) {
                        dVar70 = dVar62;
                      }
                      dVar66 = dVar62;
                      if (local_1f0 == 0) {
                        uVar59 = -(ulong)(*(double *)(lVar45 + lVar39 * 8) <= 0.0);
                        dVar62 = (double)(~uVar59 & (ulong)dVar62 | (ulong)dVar70 & uVar59);
                        dVar66 = dVar62;
                      }
                    }
                    dVar70 = *(double *)(lVar45 + lVar39 * 8);
                    dVar58 = dVar62;
                    if ((dVar70 <= 1e-08) && (dVar58 = dVar66, -1e-08 <= dVar70)) {
                      dVar58 = (dVar62 + dVar66) * 0.5;
                    }
                  }
                  pdVar52[lVar39] = dVar58;
                  lVar39 = lVar39 + 1;
                } while ((iVar41 - iVar8) + 1 != (int)lVar39);
              }
              local_1e0 = local_1e0 + 1;
              lVar45 = lVar45 + lVar29 * 8;
              pdVar52 = pdVar52 + lVar25;
              pdVar47 = pdVar47 + lVar15;
            } while (iVar5 + 1 != (int)local_1e0);
          }
          bVar54 = iVar13 != iVar37;
          iVar13 = iVar13 + 1;
        } while (bVar54);
      }
      local_1f0 = local_1f0 + 1;
      local_f8 = local_f8 + lVar18;
      local_100 = local_100 + lVar44;
    } while (local_1f0 != (uint)ncomp);
  }
  pVar19 = anon_unknown.dwarf_53122a::has_extdir_or_ho(bcrec,ncomp,1);
  if (((((ushort)pVar19 & 1) == 0) || (iVar7 < iVar10 + -1)) &&
     ((((ushort)pVar19 >> 8 & 1) == 0 || (iVar33 < iVar46)))) {
    if (0 < ncomp) {
      lVar15 = q->jstride;
      lVar29 = vmac->jstride;
      lVar25 = yedge->jstride;
      iVar1 = (vmac->begin).y;
      iVar3 = (vmac->begin).x;
      uVar6 = (q->begin).y;
      iVar46 = iVar46 + 1;
      lVar51 = (long)(q->begin).x;
      local_140 = q->p;
      local_198 = local_140 + (((int)(iVar7 + ~uVar6) * lVar15 + lVar48) - lVar51);
      local_138 = local_140 + (((int)(iVar46 - uVar6) * lVar15 + lVar48) - lVar51);
      local_160 = local_140 + (lVar48 - lVar51);
      local_140 = local_140 + (((lVar21 - (int)uVar6) * lVar15 + lVar48) - lVar51);
      pdVar16 = vmac->p;
      lVar26 = vmac->kstride;
      iVar7 = (vmac->begin).z;
      local_1c8 = yedge->p +
                  (((lVar21 - (yedge->begin).y) * lVar25 + lVar48) - (long)(yedge->begin).x);
      lVar17 = yedge->kstride;
      lVar18 = yedge->nstride;
      iVar41 = (yedge->begin).z;
      lVar40 = q->nstride;
      lVar44 = q->kstride;
      iVar32 = (q->begin).z;
      lVar51 = lVar15 * 8;
      uVar59 = 0;
      do {
        if (iVar9 <= iVar37) {
          bVar27 = uVar59 == 1 && is_velocity;
          iVar28 = iVar9;
          do {
            if (iVar10 <= iVar33) {
              lVar22 = (long)iVar28;
              lVar43 = (long)pdVar16 +
                       (lVar22 - iVar7) * lVar26 * 8 +
                       lVar48 * 8 + (lVar21 - iVar1) * lVar29 * 8 + (long)iVar3 * -8;
              pdVar47 = (double *)((lVar22 - iVar41) * lVar17 * 8 + (long)local_1c8);
              lVar49 = (lVar22 - iVar32) * lVar44 * 8;
              pdVar30 = (double *)((long)local_140 + lVar49);
              lVar22 = lVar21;
              iVar11 = ~uVar6 + iVar10;
              iVar36 = (iVar10 - uVar6) + -2;
              iVar12 = iVar10 - uVar6;
              do {
                iVar12 = iVar12 + 1;
                if (iVar8 <= iVar4) {
                  iVar31 = d_bcrec_ptr[uVar59].bc[1];
                  iVar13 = d_bcrec_ptr[uVar59].bc[4];
                  lVar23 = 0;
                  do {
                    dVar58 = pdVar30[lVar23];
                    dVar66 = *(double *)((long)local_160 + lVar23 * 8 + iVar11 * lVar51 + lVar49);
                    dVar65 = (dVar58 - dVar66) + (dVar58 - dVar66);
                    dVar62 = *(double *)((long)local_160 + lVar23 * 8 + iVar12 * lVar51 + lVar49);
                    dVar70 = *(double *)((long)local_160 + lVar23 * 8 + iVar36 * lVar51 + lVar49);
                    dVar61 = dVar66 - dVar70;
                    dVar60 = dVar62 - dVar58;
                    dVar61 = dVar61 + dVar61;
                    dVar60 = dVar60 + dVar60;
                    auVar68._0_8_ = ABS(dVar65);
                    auVar68._8_8_ = ABS(dVar60);
                    dVar70 = (dVar58 - dVar70) * 0.5;
                    dVar62 = (dVar62 - dVar66) * 0.5;
                    auVar74._0_8_ = ABS(dVar61);
                    uVar56 = -(ulong)(0.0 < dVar70);
                    uVar57 = -(ulong)(0.0 < dVar62);
                    auVar81._0_8_ = ABS(dVar70);
                    auVar81._8_8_ = ABS(dVar62);
                    auVar74._8_8_ = auVar68._0_8_;
                    auVar83 = minpd(auVar81,auVar74);
                    auVar83 = minpd(auVar68,auVar83);
                    uVar71 = -(ulong)(0.0 < dVar65 * dVar61) & auVar83._0_8_;
                    uVar78 = -(ulong)(0.0 < dVar65 * dVar60) & auVar83._8_8_;
                    auVar75._0_8_ = uVar71 & uVar56;
                    auVar75._8_8_ = uVar78 & uVar57;
                    auVar63._0_8_ = ~uVar56 & (uVar71 ^ 0x8000000000000000);
                    auVar63._8_8_ = ~uVar57 & (uVar78 ^ 0x8000000000000000);
                    dVar66 = SUB168(auVar63 | auVar75,0) * 0.5 + dVar66;
                    dVar58 = SUB168(auVar63 | auVar75,8) * -0.5 + dVar58;
                    if (lVar22 == lVar24) {
                      switch(iVar31) {
                      case 1:
                      case 2:
                      case 4:
switchD_002cca92_caseD_1:
                        dVar66 = dVar58;
                        break;
                      case 3:
                        dVar66 = *(double *)((long)local_198 + lVar23 * 8 + lVar49);
                        if (bVar27) {
switchD_002ccab8_caseD_1:
                          dVar58 = dVar66;
                        }
                        break;
                      case -1:
switchD_002cca92_caseD_ffffffff:
                        dVar66 = 0.0;
                        dVar58 = 0.0;
                      }
                    }
                    else if (lVar22 == iVar46) {
                      switch(iVar13) {
                      case 1:
                      case 2:
                      case 4:
                        goto switchD_002ccab8_caseD_1;
                      case 3:
                        dVar58 = *(double *)((long)local_138 + lVar23 * 8 + lVar49);
                        if (bVar27) goto switchD_002cca92_caseD_1;
                        break;
                      case -1:
                        goto switchD_002cca92_caseD_ffffffff;
                      }
                    }
                    if ((lVar22 == lVar24) && ((iVar31 == 4 || (iVar31 == 2)))) {
                      dVar62 = dVar58;
                      if ((is_velocity) && (dVar62 = 0.0, dVar58 <= 0.0)) {
                        dVar62 = dVar58;
                      }
                      dVar66 = dVar58;
                      if (uVar59 == 1) {
                        uVar56 = -(ulong)(0.0 <= *(double *)(lVar43 + lVar23 * 8));
                        dVar66 = (double)(uVar56 & (ulong)dVar62 | ~uVar56 & (ulong)dVar58);
                        dVar58 = dVar66;
                      }
                    }
                    if ((lVar22 == iVar46) && ((iVar13 == 4 || (iVar13 == 2)))) {
                      dVar62 = dVar66;
                      if ((is_velocity) && (dVar62 = 0.0, 0.0 <= dVar66)) {
                        dVar62 = dVar66;
                      }
                      dVar58 = dVar66;
                      if (uVar59 == 1) {
                        uVar56 = -(ulong)(*(double *)(lVar43 + lVar23 * 8) <= 0.0);
                        dVar66 = (double)(~uVar56 & (ulong)dVar66 | (ulong)dVar62 & uVar56);
                        dVar58 = dVar66;
                      }
                    }
                    dVar62 = *(double *)(lVar43 + lVar23 * 8);
                    dVar70 = dVar66;
                    if ((dVar62 <= 1e-08) && (dVar70 = dVar58, -1e-08 <= dVar62)) {
                      dVar70 = (dVar58 + dVar66) * 0.5;
                    }
                    pdVar47[lVar23] = dVar70;
                    lVar23 = lVar23 + 1;
                  } while ((iVar4 - iVar8) + 1 != (int)lVar23);
                }
                lVar22 = lVar22 + 1;
                lVar43 = lVar43 + lVar29 * 8;
                pdVar47 = pdVar47 + lVar25;
                iVar36 = iVar36 + 1;
                iVar11 = iVar11 + 1;
                pdVar30 = pdVar30 + lVar15;
              } while (iVar33 + 1 != (int)lVar22);
            }
            bVar54 = iVar28 != iVar37;
            iVar28 = iVar28 + 1;
          } while (bVar54);
        }
        uVar59 = uVar59 + 1;
        local_1c8 = local_1c8 + lVar18;
        local_198 = local_198 + lVar40;
        local_138 = local_138 + lVar40;
        local_160 = local_160 + lVar40;
        local_140 = local_140 + lVar40;
      } while (uVar59 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar51 = q->jstride;
    lVar15 = vmac->jstride;
    iVar1 = (vmac->begin).y;
    uVar6 = (q->begin).y;
    lVar25 = (long)(q->begin).x;
    iVar36 = iVar46 + 1;
    lVar29 = yedge->jstride;
    local_100 = q->p;
    local_118 = local_100 + (((int)(~uVar6 + iVar7) * lVar51 + lVar48) - lVar25);
    local_128 = local_100 + ((lVar51 * (lVar21 - (int)uVar6) + lVar48) - lVar25);
    local_f8 = local_100 + ((((lVar21 - (int)uVar6) + -1) * lVar51 + lVar48) - lVar25);
    local_e0 = local_100 + (lVar48 - lVar25);
    local_100 = local_100 + (((int)(iVar36 - uVar6) * lVar51 + lVar48) - lVar25);
    iVar3 = (vmac->begin).x;
    pdVar16 = vmac->p;
    lVar25 = vmac->kstride;
    iVar41 = (vmac->begin).z;
    local_d8 = yedge->p + (((lVar21 - (yedge->begin).y) * lVar29 + lVar48) - (long)(yedge->begin).x)
    ;
    lVar26 = yedge->kstride;
    lVar17 = yedge->nstride;
    iVar32 = (yedge->begin).z;
    lVar18 = q->nstride;
    lVar40 = q->kstride;
    iVar28 = (q->begin).z;
    local_1f0 = 0;
    do {
      if (iVar9 <= iVar37) {
        bVar27 = local_1f0 == 1 && is_velocity;
        iVar11 = iVar9;
        do {
          if (iVar10 <= iVar33) {
            lVar44 = (long)iVar11;
            lVar49 = (lVar44 - iVar28) * lVar40 * 8;
            local_200 = (double *)((long)local_128 + lVar49);
            local_1f8 = (double *)((long)local_f8 + lVar49);
            lVar22 = (long)pdVar16 +
                     (lVar44 - iVar41) * lVar25 * 8 +
                     lVar48 * 8 + (lVar21 - iVar1) * lVar15 * 8 + (long)iVar3 * -8;
            pdVar30 = (double *)((lVar44 - iVar32) * lVar26 * 8 + (long)local_d8);
            lVar44 = lVar21;
            iVar12 = (iVar10 - uVar6) + -2;
            iVar31 = iVar10 - uVar6;
            do {
              iVar31 = iVar31 + 1;
              if (iVar8 <= iVar4) {
                iVar13 = d_bcrec_ptr[local_1f0].bc[1];
                iVar14 = d_bcrec_ptr[local_1f0].bc[4];
                bVar55 = 1 < iVar13 - 3U;
                bVar54 = iVar13 == 4 || iVar14 == 3;
                iVar42 = (int)lVar44 + -1;
                lVar43 = 0;
                do {
                  if (lVar24 < lVar44 || iVar13 != 3) {
                    if (iVar46 < lVar44 && iVar14 == 3) {
                      dVar62 = *(double *)((long)local_100 + lVar43 * 8 + lVar49);
                    }
                    else {
                      dVar66 = local_200[lVar43];
                      dVar70 = local_1f8[lVar43];
                      dVar62 = *(double *)
                                ((long)local_e0 + lVar43 * 8 + (long)iVar31 * lVar51 * 8 + lVar49);
                      if (lVar44 != lVar24 || bVar55) {
                        dVar58 = (dVar62 - dVar70) * 0.5;
                        if (lVar44 == iVar46 && bVar54) {
                          dVar58 = (dVar62 * 4.0 + dVar66 * -3.0) - dVar70;
                          goto LAB_002cc266;
                        }
                      }
                      else {
                        dVar58 = dVar70 * -4.0 + dVar66 * 3.0 + dVar62;
LAB_002cc266:
                        dVar58 = dVar58 / 3.0;
                      }
                      dVar79 = (dVar66 - dVar70) + (dVar66 - dVar70);
                      dVar60 = (dVar62 - dVar66) + (dVar62 - dVar66);
                      dVar65 = ABS(dVar79);
                      dVar61 = ABS(dVar60);
                      dVar62 = ABS(dVar58);
                      if (dVar65 <= ABS(dVar58)) {
                        dVar62 = dVar65;
                      }
                      if (dVar62 <= dVar61) {
                        dVar61 = dVar62;
                      }
                      uVar59 = -(ulong)(0.0 < dVar79 * dVar60) & (ulong)dVar61;
                      dVar62 = *(double *)
                                ((long)local_e0 + lVar43 * 8 + (long)iVar12 * lVar51 * 8 + lVar49);
                      if (iVar7 != iVar42 || bVar55) {
                        dVar61 = (dVar66 - dVar62) * 0.5;
                        if (iVar46 == iVar42 && bVar54) {
                          dVar61 = ((dVar66 * 4.0 + dVar70 * -3.0) - dVar62) / 3.0;
                        }
                      }
                      else {
                        dVar61 = (dVar62 * -4.0 + dVar70 * 3.0 + dVar66) / 3.0;
                      }
                      dVar66 = (double)(~-(ulong)(0.0 < dVar58) & (uVar59 ^ 0x8000000000000000) |
                                       -(ulong)(0.0 < dVar58) & uVar59) * -0.5 + dVar66;
                      dVar58 = (dVar70 - dVar62) + (dVar70 - dVar62);
                      dVar60 = ABS(dVar58);
                      dVar62 = ABS(dVar61);
                      if (dVar60 <= ABS(dVar61)) {
                        dVar62 = dVar60;
                      }
                      if (dVar62 <= dVar65) {
                        dVar65 = dVar62;
                      }
                      uVar59 = -(ulong)(0.0 < dVar79 * dVar58) & (ulong)dVar65;
                      dVar70 = (double)(~-(ulong)(0.0 < dVar61) & (uVar59 ^ 0x8000000000000000) |
                                       -(ulong)(0.0 < dVar61) & uVar59) * 0.5 + dVar70;
                      if (lVar44 == lVar24) {
                        switch(iVar13) {
                        case 1:
                        case 2:
                        case 4:
                          dVar70 = dVar66;
                          break;
                        case 3:
                          dVar70 = *(double *)((long)local_118 + lVar43 * 8 + lVar49);
                          if (bVar27) {
                            dVar66 = dVar70;
                          }
                          goto LAB_002cc473;
                        case -1:
                          dVar70 = 0.0;
                          dVar66 = 0.0;
                        }
switchD_002cc3e5_caseD_0:
                      }
                      else if (lVar44 == iVar36) {
                        switch(iVar14) {
                        case 0:
                          break;
                        case 1:
                        case 2:
                        case 4:
                          dVar66 = dVar70;
                          break;
                        case 3:
                          dVar66 = *(double *)((long)local_100 + lVar43 * 8 + lVar49);
                          if (bVar27) {
                            dVar70 = dVar66;
                          }
                          goto LAB_002cc473;
                        case -1:
                          dVar70 = 0.0;
                          dVar66 = 0.0;
                          break;
                        default:
                          goto switchD_002cc3e5_caseD_0;
                        }
                        goto switchD_002cc3e5_caseD_0;
                      }
LAB_002cc473:
                      if ((lVar44 == lVar24) && ((iVar13 == 4 || (iVar13 == 2)))) {
                        dVar62 = dVar66;
                        if ((is_velocity) && (dVar62 = 0.0, dVar66 <= 0.0)) {
                          dVar62 = dVar66;
                        }
                        dVar70 = dVar66;
                        if (local_1f0 == 1) {
                          uVar59 = -(ulong)(0.0 <= *(double *)(lVar22 + lVar43 * 8));
                          dVar66 = (double)(uVar59 & (ulong)dVar62 | ~uVar59 & (ulong)dVar66);
                          dVar70 = dVar66;
                        }
                      }
                      if ((lVar44 == iVar36) && ((iVar14 == 4 || (iVar14 == 2)))) {
                        dVar62 = dVar70;
                        if ((is_velocity) && (dVar62 = 0.0, 0.0 <= dVar70)) {
                          dVar62 = dVar70;
                        }
                        dVar66 = dVar70;
                        if (local_1f0 == 1) {
                          uVar59 = -(ulong)(*(double *)(lVar22 + lVar43 * 8) <= 0.0);
                          dVar70 = (double)(~uVar59 & (ulong)dVar70 | (ulong)dVar62 & uVar59);
                          dVar66 = dVar70;
                        }
                      }
                      dVar58 = *(double *)(lVar22 + lVar43 * 8);
                      dVar62 = dVar70;
                      if ((dVar58 <= 1e-08) && (dVar62 = dVar66, -1e-08 <= dVar58)) {
                        dVar62 = (dVar70 + dVar66) * 0.5;
                      }
                    }
                  }
                  else {
                    dVar62 = *(double *)((long)local_118 + lVar43 * 8 + lVar49);
                  }
                  pdVar30[lVar43] = dVar62;
                  lVar43 = lVar43 + 1;
                } while ((iVar4 - iVar8) + 1 != (int)lVar43);
              }
              lVar44 = lVar44 + 1;
              local_200 = local_200 + lVar51;
              local_1f8 = local_1f8 + lVar51;
              iVar12 = iVar12 + 1;
              lVar22 = lVar22 + lVar15 * 8;
              pdVar30 = pdVar30 + lVar29;
            } while (iVar33 + 1 != (int)lVar44);
          }
          bVar54 = iVar11 != iVar37;
          iVar11 = iVar11 + 1;
        } while (bVar54);
      }
      local_1f0 = local_1f0 + 1;
      local_118 = local_118 + lVar18;
      local_128 = local_128 + lVar18;
      local_f8 = local_f8 + lVar18;
      local_e0 = local_e0 + lVar18;
      local_100 = local_100 + lVar18;
      local_d8 = local_d8 + lVar17;
    } while (local_1f0 != (uint)ncomp);
  }
  pVar19 = anon_unknown.dwarf_53122a::has_extdir_or_ho(bcrec,ncomp,2);
  if (((pVar19.first & iVar9 + -1 <= iVar2) == 0) &&
     ((((ushort)pVar19 >> 8 & 1) == 0 || (iVar20 < iVar34)))) {
    if (0 < ncomp) {
      lVar24 = q->jstride;
      uVar6 = (q->begin).z;
      lVar51 = wmac->jstride;
      lVar15 = zedge->jstride;
      iVar1 = (wmac->begin).y;
      iVar3 = (wmac->begin).x;
      iVar34 = iVar34 + 1;
      lVar25 = (lVar21 - (q->begin).y) * lVar24;
      lVar29 = q->kstride;
      lVar26 = (long)(q->begin).x;
      local_1b0 = q->p;
      local_1c8 = local_1b0 + (((int)(iVar2 + ~uVar6) * lVar29 + lVar25 + lVar48) - lVar26);
      local_c0 = local_1b0 + (((int)(iVar34 - uVar6) * lVar29 + lVar25 + lVar48) - lVar26);
      local_1b0 = local_1b0 + ((lVar25 + lVar48) - lVar26);
      lVar25 = q->nstride;
      pdVar16 = wmac->p;
      lVar26 = wmac->kstride;
      iVar7 = (wmac->begin).z;
      local_180 = zedge->p +
                  (((lVar21 - (zedge->begin).y) * lVar15 + lVar48) - (long)(zedge->begin).x);
      lVar17 = zedge->kstride;
      lVar18 = zedge->nstride;
      iVar46 = (zedge->begin).z;
      lVar29 = lVar29 * 8;
      uVar59 = 0;
      do {
        if (iVar9 <= iVar20) {
          bVar27 = uVar59 == 2 && is_velocity;
          iVar33 = ~uVar6 + iVar9;
          iVar37 = (iVar9 - uVar6) + -2;
          iVar41 = iVar9 - uVar6;
          iVar32 = iVar9;
          do {
            iVar41 = iVar41 + 1;
            if (iVar10 <= iVar5) {
              lVar40 = (long)iVar32;
              lVar44 = (long)pdVar16 +
                       (lVar40 - iVar7) * lVar26 * 8 +
                       lVar48 * 8 + (lVar21 - iVar1) * lVar51 * 8 + (long)iVar3 * -8;
              pdVar50 = (double *)((lVar40 - iVar46) * lVar17 * 8 + (long)local_180);
              pdVar53 = (double *)(iVar37 * lVar29 + (long)local_1b0);
              pdVar30 = (double *)(iVar41 * lVar29 + (long)local_1b0);
              pdVar47 = (double *)(iVar33 * lVar29 + (long)local_1b0);
              pdVar52 = (double *)((lVar40 - (int)uVar6) * lVar29 + (long)local_1b0);
              local_1a8 = local_c0;
              local_158 = local_1c8;
              lVar40 = lVar21;
              do {
                if (iVar8 <= iVar4) {
                  iVar28 = d_bcrec_ptr[uVar59].bc[2];
                  iVar36 = d_bcrec_ptr[uVar59].bc[5];
                  lVar22 = 0;
                  do {
                    dVar70 = pdVar52[lVar22];
                    dVar62 = pdVar47[lVar22];
                    dVar66 = (dVar70 - dVar62) + (dVar70 - dVar62);
                    dVar58 = dVar62 - pdVar53[lVar22];
                    dVar65 = pdVar30[lVar22] - dVar70;
                    dVar58 = dVar58 + dVar58;
                    dVar65 = dVar65 + dVar65;
                    auVar69._0_8_ = ABS(dVar66);
                    auVar69._8_8_ = ABS(dVar65);
                    dVar61 = (dVar70 - pdVar53[lVar22]) * 0.5;
                    dVar60 = (pdVar30[lVar22] - dVar62) * 0.5;
                    auVar76._0_8_ = ABS(dVar58);
                    uVar56 = -(ulong)(0.0 < dVar61);
                    uVar57 = -(ulong)(0.0 < dVar60);
                    auVar82._0_8_ = ABS(dVar61);
                    auVar82._8_8_ = ABS(dVar60);
                    auVar76._8_8_ = auVar69._0_8_;
                    auVar83 = minpd(auVar82,auVar76);
                    auVar83 = minpd(auVar69,auVar83);
                    uVar71 = -(ulong)(0.0 < dVar66 * dVar58) & auVar83._0_8_;
                    uVar78 = -(ulong)(0.0 < dVar66 * dVar65) & auVar83._8_8_;
                    auVar77._0_8_ = uVar71 & uVar56;
                    auVar77._8_8_ = uVar78 & uVar57;
                    auVar64._0_8_ = ~uVar56 & (uVar71 ^ 0x8000000000000000);
                    auVar64._8_8_ = ~uVar57 & (uVar78 ^ 0x8000000000000000);
                    dVar62 = SUB168(auVar64 | auVar77,0) * 0.5 + dVar62;
                    dVar70 = SUB168(auVar64 | auVar77,8) * -0.5 + dVar70;
                    if (iVar2 == iVar32) {
                      switch(iVar28) {
                      case 1:
                      case 2:
                      case 4:
switchD_002cd9fe_caseD_1:
                        dVar62 = dVar70;
                        break;
                      case 3:
                        dVar62 = local_158[lVar22];
                        if (bVar27) {
switchD_002cda25_caseD_1:
                          dVar70 = dVar62;
                        }
                        break;
                      case -1:
switchD_002cd9fe_caseD_ffffffff:
                        dVar62 = 0.0;
                        dVar70 = 0.0;
                      }
                    }
                    else if (iVar34 == iVar32) {
                      switch(iVar36) {
                      case 1:
                      case 2:
                      case 4:
                        goto switchD_002cda25_caseD_1;
                      case 3:
                        dVar70 = local_1a8[lVar22];
                        if (bVar27) goto switchD_002cd9fe_caseD_1;
                        break;
                      case -1:
                        goto switchD_002cd9fe_caseD_ffffffff;
                      }
                    }
                    if ((iVar2 == iVar32) && ((iVar28 == 4 || (iVar28 == 2)))) {
                      dVar66 = dVar70;
                      if ((is_velocity) && (dVar66 = 0.0, dVar70 <= 0.0)) {
                        dVar66 = dVar70;
                      }
                      dVar62 = dVar70;
                      if (uVar59 == 2) {
                        uVar56 = -(ulong)(0.0 <= *(double *)(lVar44 + lVar22 * 8));
                        dVar62 = (double)(uVar56 & (ulong)dVar66 | ~uVar56 & (ulong)dVar70);
                        dVar70 = dVar62;
                      }
                    }
                    if ((iVar34 == iVar32) && ((iVar36 == 4 || (iVar36 == 2)))) {
                      dVar66 = dVar62;
                      if ((is_velocity) && (dVar66 = 0.0, 0.0 <= dVar62)) {
                        dVar66 = dVar62;
                      }
                      dVar70 = dVar62;
                      if (uVar59 == 2) {
                        uVar56 = -(ulong)(*(double *)(lVar44 + lVar22 * 8) <= 0.0);
                        dVar62 = (double)(~uVar56 & (ulong)dVar62 | (ulong)dVar66 & uVar56);
                        dVar70 = dVar62;
                      }
                    }
                    dVar66 = *(double *)(lVar44 + lVar22 * 8);
                    dVar58 = dVar62;
                    if ((dVar66 <= 1e-08) && (dVar58 = dVar70, -1e-08 <= dVar66)) {
                      dVar58 = (dVar70 + dVar62) * 0.5;
                    }
                    pdVar50[lVar22] = dVar58;
                    lVar22 = lVar22 + 1;
                  } while ((iVar4 - iVar8) + 1 != (int)lVar22);
                }
                lVar40 = lVar40 + 1;
                lVar44 = lVar44 + lVar51 * 8;
                pdVar50 = pdVar50 + lVar15;
                local_158 = local_158 + lVar24;
                local_1a8 = local_1a8 + lVar24;
                pdVar53 = pdVar53 + lVar24;
                pdVar30 = pdVar30 + lVar24;
                pdVar47 = pdVar47 + lVar24;
                pdVar52 = pdVar52 + lVar24;
              } while (iVar5 + 1 != (int)lVar40);
            }
            iVar37 = iVar37 + 1;
            iVar33 = iVar33 + 1;
            bVar54 = iVar32 != iVar20;
            iVar32 = iVar32 + 1;
          } while (bVar54);
        }
        uVar59 = uVar59 + 1;
        local_180 = local_180 + lVar18;
        local_1c8 = local_1c8 + lVar25;
        local_c0 = local_c0 + lVar25;
        local_1b0 = local_1b0 + lVar25;
      } while (uVar59 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    local_1b8 = q->p;
    lVar24 = q->jstride;
    lVar51 = q->kstride;
    uVar6 = (q->begin).z;
    lVar15 = wmac->jstride;
    lVar29 = (long)(q->begin).x;
    iVar37 = iVar34 + 1;
    lVar25 = (lVar21 - (q->begin).y) * lVar24;
    iVar1 = (wmac->begin).y;
    local_168 = local_1b8 + ((lVar25 + lVar48 + (int)(~uVar6 + iVar2) * lVar51) - lVar29);
    local_f0 = local_1b8 + ((lVar25 + lVar48 + (int)(iVar37 - uVar6) * lVar51) - lVar29);
    local_1b8 = local_1b8 + ((lVar25 + lVar48) - lVar29);
    iVar3 = (wmac->begin).x;
    lVar29 = zedge->jstride;
    lVar25 = q->nstride;
    pdVar16 = wmac->p;
    lVar26 = wmac->kstride;
    iVar7 = (wmac->begin).z;
    local_148 = zedge->p +
                (((lVar21 - (zedge->begin).y) * lVar29 + lVar48) - (long)(zedge->begin).x);
    lVar17 = zedge->kstride;
    lVar18 = zedge->nstride;
    iVar46 = (zedge->begin).z;
    lVar51 = lVar51 * 8;
    local_190 = 0;
    do {
      if (iVar9 <= iVar20) {
        bVar27 = local_190 == 2 && is_velocity;
        iVar41 = iVar9 + -1;
        iVar33 = (iVar9 - uVar6) + -2;
        iVar32 = iVar9 - uVar6;
        iVar28 = iVar9;
        do {
          iVar32 = iVar32 + 1;
          if (iVar10 <= iVar5) {
            pdVar47 = (double *)(iVar33 * lVar51 + (long)local_1b8);
            local_1f8 = (double *)(iVar32 * lVar51 + (long)local_1b8);
            local_1a8 = (double *)(((long)iVar41 + -(long)(int)uVar6) * lVar51 + (long)local_1b8);
            lVar40 = (long)iVar28;
            local_1c0 = (double *)((-(long)(int)uVar6 + lVar40) * lVar51 + (long)local_1b8);
            lVar44 = (long)pdVar16 +
                     (lVar40 - iVar7) * lVar26 * 8 +
                     lVar48 * 8 + (lVar21 - iVar1) * lVar15 * 8 + (long)iVar3 * -8;
            pdVar52 = (double *)((lVar40 - iVar46) * lVar17 * 8 + (long)local_148);
            local_200 = local_f0;
            lVar40 = lVar21;
            pdVar30 = local_168;
            do {
              if (iVar8 <= iVar4) {
                iVar36 = d_bcrec_ptr[local_190].bc[2];
                iVar11 = d_bcrec_ptr[local_190].bc[5];
                bVar55 = iVar11 == 3;
                bVar54 = 1 < iVar36 - 3U;
                lVar22 = 0;
                do {
                  if (iVar36 == 3 && iVar28 <= iVar2) {
                    dVar62 = pdVar30[lVar22];
                    goto LAB_002cd170;
                  }
                  if (iVar34 < iVar28 && bVar55) {
                    dVar62 = local_200[lVar22];
                    goto LAB_002cd170;
                  }
                  dVar66 = local_1c0[lVar22];
                  dVar70 = local_1a8[lVar22];
                  dVar62 = local_1f8[lVar22];
                  if (iVar2 != iVar28 || bVar54) {
                    dVar58 = (dVar62 - dVar70) * 0.5;
                    if (iVar34 == iVar28 && (iVar36 == 4 || bVar55)) {
                      dVar58 = ((dVar62 * 4.0 + dVar66 * -3.0) - dVar70) / 3.0;
                    }
                  }
                  else {
                    dVar58 = (dVar70 * -4.0 + dVar66 * 3.0 + dVar62) / 3.0;
                  }
                  dVar79 = (dVar66 - dVar70) + (dVar66 - dVar70);
                  dVar60 = (dVar62 - dVar66) + (dVar62 - dVar66);
                  dVar65 = ABS(dVar79);
                  dVar61 = ABS(dVar60);
                  dVar62 = ABS(dVar58);
                  if (dVar65 <= ABS(dVar58)) {
                    dVar62 = dVar65;
                  }
                  if (dVar62 <= dVar61) {
                    dVar61 = dVar62;
                  }
                  uVar59 = -(ulong)(0.0 < dVar79 * dVar60) & (ulong)dVar61;
                  dVar62 = pdVar47[lVar22];
                  if (iVar28 + -1 != iVar2 || bVar54) {
                    dVar61 = (dVar66 - dVar62) * 0.5;
                    if ((iVar36 == 4 || bVar55) && iVar28 + -1 == iVar34) {
                      dVar61 = (dVar66 * 4.0 + dVar70 * -3.0) - dVar62;
                      goto LAB_002cd2e2;
                    }
                  }
                  else {
                    dVar61 = dVar62 * -4.0 + dVar70 * 3.0 + dVar66;
LAB_002cd2e2:
                    dVar61 = dVar61 / 3.0;
                  }
                  dVar66 = (double)(~-(ulong)(0.0 < dVar58) & (uVar59 ^ 0x8000000000000000) |
                                   -(ulong)(0.0 < dVar58) & uVar59) * -0.5 + dVar66;
                  dVar58 = (dVar70 - dVar62) + (dVar70 - dVar62);
                  dVar60 = ABS(dVar58);
                  dVar62 = ABS(dVar61);
                  if (dVar60 <= ABS(dVar61)) {
                    dVar62 = dVar60;
                  }
                  if (dVar62 <= dVar65) {
                    dVar65 = dVar62;
                  }
                  uVar59 = -(ulong)(0.0 < dVar79 * dVar58) & (ulong)dVar65;
                  dVar70 = (double)(~-(ulong)(0.0 < dVar61) & (uVar59 ^ 0x8000000000000000) |
                                   -(ulong)(0.0 < dVar61) & uVar59) * 0.5 + dVar70;
                  if (iVar2 != iVar28) {
                    if (iVar37 == iVar28) {
                      switch(iVar11) {
                      case 0:
                        break;
                      case 1:
                      case 2:
                      case 4:
                        dVar66 = dVar70;
                        break;
                      case 3:
                        dVar66 = local_200[lVar22];
                        if (bVar27) {
                          dVar70 = dVar66;
                        }
                        break;
                      case -1:
                        dVar70 = 0.0;
                        dVar66 = 0.0;
                        break;
                      default:
                        goto switchD_002cd376_default;
                      }
                    }
                    goto switchD_002cd376_default;
                  }
                  switch(iVar36) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar70 = dVar66;
                    break;
                  case 3:
                    dVar70 = pdVar30[lVar22];
                    if (bVar27) {
                      dVar66 = dVar70;
                    }
                    goto switchD_002cd376_default;
                  case -1:
                    dVar70 = 0.0;
                    dVar66 = 0.0;
                    break;
                  default:
                    goto switchD_002cd376_default;
                  }
switchD_002cd376_default:
                  if ((iVar2 == iVar28) && ((iVar36 == 4 || (iVar36 == 2)))) {
                    dVar62 = dVar66;
                    if ((is_velocity) && (dVar62 = 0.0, dVar66 <= 0.0)) {
                      dVar62 = dVar66;
                    }
                    dVar70 = dVar66;
                    if (local_190 == 2) {
                      uVar59 = -(ulong)(0.0 <= *(double *)(lVar44 + lVar22 * 8));
                      dVar66 = (double)(uVar59 & (ulong)dVar62 | ~uVar59 & (ulong)dVar66);
                      dVar70 = dVar66;
                    }
                  }
                  if ((iVar37 == iVar28) && ((iVar11 == 4 || (iVar11 == 2)))) {
                    dVar62 = dVar70;
                    if ((is_velocity) && (dVar62 = 0.0, 0.0 <= dVar70)) {
                      dVar62 = dVar70;
                    }
                    dVar66 = dVar70;
                    if (local_190 == 2) {
                      uVar59 = -(ulong)(*(double *)(lVar44 + lVar22 * 8) <= 0.0);
                      dVar70 = (double)(~uVar59 & (ulong)dVar70 | (ulong)dVar62 & uVar59);
                      dVar66 = dVar70;
                    }
                  }
                  dVar58 = *(double *)(lVar44 + lVar22 * 8);
                  dVar62 = dVar70;
                  if ((dVar58 <= 1e-08) && (dVar62 = dVar66, -1e-08 <= dVar58)) {
                    dVar62 = (dVar70 + dVar66) * 0.5;
                  }
LAB_002cd170:
                  pdVar52[lVar22] = dVar62;
                  lVar22 = lVar22 + 1;
                } while ((iVar4 - iVar8) + 1 != (int)lVar22);
              }
              lVar40 = lVar40 + 1;
              pdVar30 = pdVar30 + lVar24;
              local_200 = local_200 + lVar24;
              pdVar47 = pdVar47 + lVar24;
              local_1f8 = local_1f8 + lVar24;
              local_1a8 = local_1a8 + lVar24;
              local_1c0 = local_1c0 + lVar24;
              lVar44 = lVar44 + lVar15 * 8;
              pdVar52 = pdVar52 + lVar29;
            } while (iVar5 + 1 != (int)lVar40);
          }
          iVar33 = iVar33 + 1;
          iVar41 = iVar41 + 1;
          bVar54 = iVar28 != iVar20;
          iVar28 = iVar28 + 1;
        } while (bVar54);
      }
      local_190 = local_190 + 1;
      local_168 = local_168 + lVar25;
      local_f0 = local_f0 + lVar25;
      local_1b8 = local_1b8 + lVar25;
      local_148 = local_148 + lVar18;
    } while (local_190 != (uint)ncomp);
  }
  return;
}

Assistant:

void
MOL::ComputeEdgeState (const Box& bx,
                       AMREX_D_DECL( Array4<Real> const& xedge,
                                     Array4<Real> const& yedge,
                                     Array4<Real> const& zedge),
                       Array4<Real const> const& q,
                       const int ncomp,
                       AMREX_D_DECL( Array4<Real const> const& umac,
                                     Array4<Real const> const& vmac,
                                     Array4<Real const> const& wmac),
                       const Box&       domain,
                       const Vector<BCRec>& bcs,
                       const        BCRec * d_bcrec_ptr,
                       bool         is_velocity)
{
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM==3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 0);
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= ubx.bigEnd(0)))
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state_extdir( i, j, k, n, q, umac,
                                                                d_bcrec_ptr,
                                                                domain_ilo, domain_ihi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state( i, j, k, n, q, umac,
                                                         d_bcrec_ptr,
                                                         domain_ilo, domain_ihi,
                                                         is_velocity);
        });
    }

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 1);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi && domain_jhi <= vbx.bigEnd(1)))
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state_extdir( i, j, k, n, q, vmac,
                                                                d_bcrec_ptr,
                                                                domain_jlo, domain_jhi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state( i, j, k, n, q, vmac,
                                                         d_bcrec_ptr,
                                                         domain_jlo, domain_jhi,
                                                         is_velocity);
        });
    }


#if ( AMREX_SPACEDIM ==3 )

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 2);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= wbx.bigEnd(2)))
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state_extdir( i, j, k, n, q, wmac,
                                                                d_bcrec_ptr,
                                                                domain_klo, domain_khi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state( i, j, k, n, q, wmac,
                                                         d_bcrec_ptr,
                                                         domain_klo, domain_khi,
                                                         is_velocity);
        });
    }

#endif
}